

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::do_udp(Server *this)

{
  int iVar1;
  __pid_t __val;
  char *__src;
  __cxx11 local_e0 [32];
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [34];
  undefined1 local_7e [8];
  sockaddr_un name;
  Server *this_local;
  
  name.sun_path._100_8_ = this;
  iVar1 = socket(1,0x802,0);
  this->udp_fd = iVar1;
  if (this->udp_fd < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
            0xbd);
    fprintf(_stderr,"--> %s\n","this->udp_fd");
    perror("info");
    exit(1);
  }
  local_7e._0_2_ = 1;
  __val = getpid();
  std::__cxx11::to_string(local_e0,__val);
  std::operator+((char *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/tmp/webed_")
  ;
  std::operator+(local_a0,(char *)local_c0);
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(local_7e + 2,__src);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)local_e0);
  iVar1 = bind(this->udp_fd,(sockaddr *)local_7e,0x6e);
  if (iVar1 < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
            0xc3);
    fprintf(_stderr,"--> %s\n",
            "bind(this->udp_fd, (struct sockaddr *) &name, sizeof(struct sockaddr_un))");
    perror("info");
    exit(1);
  }
  return;
}

Assistant:

void Server::do_udp() {
    this->udp_fd = socket(AF_UNIX, SOCK_DGRAM | SOCK_NONBLOCK, 0);
    IF_NEGATIVE_EXIT(this->udp_fd);

    struct sockaddr_un name;

    name.sun_family = AF_UNIX;
    strcpy(name.sun_path, ("/tmp/webed_" + std::to_string(getpid()) + ".sock").c_str());
    IF_NEGATIVE_EXIT(bind(this->udp_fd, (struct sockaddr *) &name, sizeof(struct sockaddr_un)));
}